

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O1

Unique<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> __thiscall
anurbs::
new_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>const&,anurbs::Interval_const&>
          (anurbs *this,Ref<anurbs::NurbsCurveGeometry<2L>_> *args,Interval *args_1)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x28);
  peVar3 = (args->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (args->m_entry).
            super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = args_1->m_t0;
  dVar2 = args_1->m_t1;
  *puVar4 = &PTR__Curve_00387c40;
  puVar4[1] = peVar3;
  puVar4[2] = this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar4[3] = dVar1;
    puVar4[4] = dVar2;
    *(undefined8 **)this = puVar4;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    puVar4[3] = dVar1;
    puVar4[4] = dVar2;
    *(undefined8 **)this = puVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return (__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}